

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O2

void Wln_NtkStaticFanoutTest(Wln_Ntk_t *p)

{
  int iVar1;
  int *piVar2;
  int iObj;
  long lVar3;
  
  printf("Printing fanouts of %d objects of network \"%s\":\n",(ulong)(uint)(p->vTypes).nSize,
         p->pName);
  Wln_NtkStaticFanoutStart(p);
  for (iObj = 1; iObj < (p->vTypes).nSize; iObj = iObj + 1) {
    Wln_ObjPrint(p,iObj);
    printf("   Fanouts : ");
    lVar3 = 0;
    while( true ) {
      iVar1 = Vec_IntEntry(&p->vRefs,iObj);
      if (iVar1 <= lVar3) break;
      piVar2 = Wln_ObjFanouts(p,iObj);
      printf("%5d ",(ulong)(uint)piVar2[lVar3]);
      lVar3 = lVar3 + 1;
    }
    putchar(10);
  }
  Wln_NtkStaticFanoutStop(p);
  putchar(10);
  return;
}

Assistant:

void Wln_NtkStaticFanoutTest( Wln_Ntk_t * p )
{
    int k, iObj, iFanout;
    printf( "Printing fanouts of %d objects of network \"%s\":\n", Wln_NtkObjNum(p), p->pName );
    Wln_NtkStaticFanoutStart( p );
    Wln_NtkForEachObj( p, iObj )
    {
        Wln_ObjPrint( p, iObj );
        printf( "   Fanouts : " );
        Wln_ObjForEachFanoutStatic( p, iObj, iFanout, k )
            printf( "%5d ", iFanout );
        printf( "\n" );
    }
    Wln_NtkStaticFanoutStop( p );
    printf( "\n" );
}